

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O3

bool __thiscall MotionTrajectory::AddConstantVel(MotionTrajectory *this,double pEnd,bool isInfinite)

{
  pointer *pppMVar1;
  pointer ppMVar2;
  iterator __position;
  ConstantVel *this_00;
  MotionBase *prevMotion;
  double dVar3;
  double dVar4;
  MotionBase *motion;
  ConstantVel *local_28;
  
  ppMVar2 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar2 ==
      (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    prevMotion = (MotionBase *)0x0;
  }
  else {
    prevMotion = ppMVar2[-1];
  }
  this_00 = (ConstantVel *)operator_new(0x48);
  ConstantVel::ConstantVel(this_00,pEnd,isInfinite,prevMotion);
  dVar3 = (this_00->super_MotionBase).t0;
  dVar4 = (this_00->super_MotionBase).tf;
  if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
    __position._M_current =
         (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_28 = this_00;
      std::vector<MotionBase*,std::allocator<MotionBase*>>::_M_realloc_insert<MotionBase*const&>
                ((vector<MotionBase*,std::allocator<MotionBase*>> *)this,__position,
                 (MotionBase **)&local_28);
      dVar3 = (local_28->super_MotionBase).t0;
      dVar4 = (local_28->super_MotionBase).tf;
    }
    else {
      *__position._M_current = (MotionBase *)this_00;
      pppMVar1 = &(this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppMVar1 = *pppMVar1 + 1;
    }
  }
  return (bool)(-(dVar3 != dVar4) & 1);
}

Assistant:

bool MotionTrajectory::AddConstantVel(double pEnd, bool isInfinite)
{
    const MotionBase *prevMotion = GetLastMotion();
    MotionBase *motion = new ConstantVel(pEnd, isInfinite, prevMotion);
    if (motion->IsOK())
        motionList.push_back(motion);
    return motion->IsOK();
}